

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

AssociativeArrayType * __thiscall
slang::BumpAllocator::
emplace<slang::ast::AssociativeArrayType,slang::ast::Type_const&,slang::ast::Type_const*const&>
          (BumpAllocator *this,Type *args,Type **args_1)

{
  AssociativeArrayType *pAVar1;
  size_t in_RDX;
  Type *in_RSI;
  Type *in_RDI;
  AssociativeArrayType *unaff_retaddr;
  
  pAVar1 = (AssociativeArrayType *)allocate((BumpAllocator *)in_RDI,(size_t)in_RSI,in_RDX);
  ast::AssociativeArrayType::AssociativeArrayType(unaff_retaddr,in_RDI,in_RSI);
  return pAVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }